

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O3

Configuration *
rc::detail::configFromString
          (Configuration *__return_storage_ptr__,string *str,Configuration *defaults)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
  *this;
  _Rb_tree_header *p_Var1;
  __hashtable_alloc *p_Var2;
  byte bVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  const_iterator cVar10;
  undefined8 *puVar11;
  _func_bool_bool_ptr *in_R8;
  size_type __dnew_7;
  size_type __dnew_5;
  size_type __dnew_2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
  value_1;
  size_type __dnew_4;
  size_type __dnew_1;
  unsigned_long value;
  size_type __dnew_9;
  __alloc_node_gen_t __alloc_node_gen;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  __hashtable_alloc *local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  __hashtable_alloc **local_338;
  __hashtable_alloc *local_330;
  __hashtable_alloc *local_328 [6];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  string local_2c8;
  string local_2a8;
  string local_288;
  undefined1 local_268 [32];
  float local_248;
  size_t local_240;
  __node_base_ptr p_Stack_238;
  string local_230;
  string local_210;
  string local_1f0;
  key_type local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  parseMap((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_2f8,str);
  uVar4 = (defaults->testParams).seed;
  iVar7 = (defaults->testParams).maxSuccess;
  iVar8 = (defaults->testParams).maxSize;
  uVar5 = *(undefined8 *)((long)&(defaults->testParams).maxDiscardRatio + 2);
  *(undefined8 *)((long)&(__return_storage_ptr__->testParams).maxSuccess + 2) =
       *(undefined8 *)((long)&(defaults->testParams).maxSuccess + 2);
  *(undefined8 *)((long)&(__return_storage_ptr__->testParams).maxDiscardRatio + 2) = uVar5;
  (__return_storage_ptr__->testParams).seed = uVar4;
  (__return_storage_ptr__->testParams).maxSuccess = iVar7;
  (__return_storage_ptr__->testParams).maxSize = iVar8;
  this = &__return_storage_ptr__->reproduce;
  (__return_storage_ptr__->reproduce)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->reproduce)._M_h._M_bucket_count =
       (defaults->reproduce)._M_h._M_bucket_count;
  (__return_storage_ptr__->reproduce)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->reproduce)._M_h._M_element_count =
       (defaults->reproduce)._M_h._M_element_count;
  uVar9 = *(undefined4 *)&(defaults->reproduce)._M_h._M_rehash_policy.field_0x4;
  sVar6 = (defaults->reproduce)._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->reproduce)._M_h._M_rehash_policy._M_max_load_factor =
       (defaults->reproduce)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->reproduce)._M_h._M_rehash_policy.field_0x4 = uVar9;
  (__return_storage_ptr__->reproduce)._M_h._M_rehash_policy._M_next_resize = sVar6;
  (__return_storage_ptr__->reproduce)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1b0._0_8_ = this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,rc::detail::Reproduce>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,rc::detail::Reproduce>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,rc::detail::Reproduce>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,&(defaults->reproduce)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_true>_>_>
              *)local_1b0);
  local_268._8_8_ = 4;
  local_268._16_5_ = 0x64656573;
  local_1b0._0_8_ = (__hashtable_alloc *)0x1e;
  local_358 = &local_348;
  local_268._0_8_ = local_268 + 0x10;
  local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)&local_358,(ulong)local_1b0);
  local_348._M_allocated_capacity = local_1b0._0_8_;
  *(char *)((long)local_358 + 0xe) = ' ';
  *(char *)((long)local_358 + 0xf) = 'a';
  *(char *)((long)local_358 + 0x10) = ' ';
  *(char *)((long)local_358 + 0x11) = 'v';
  *(char *)((long)local_358 + 0x12) = 'a';
  *(char *)((long)local_358 + 0x13) = 'l';
  *(char *)((long)local_358 + 0x14) = 'i';
  *(char *)((long)local_358 + 0x15) = 'd';
  *(char *)((long)local_358 + 0x16) = ' ';
  *(char *)((long)local_358 + 0x17) = 'i';
  *(char *)((long)local_358 + 0x18) = 'n';
  *(char *)((long)local_358 + 0x19) = 't';
  *(char *)((long)local_358 + 0x1a) = 'e';
  *(char *)((long)local_358 + 0x1b) = 'g';
  *(char *)((long)local_358 + 0x1c) = 'e';
  *(char *)((long)local_358 + 0x1d) = 'r';
  local_358->_M_allocated_capacity = 0x6d20276465657327;
  *(char *)((long)local_358 + 8) = 'u';
  *(char *)((long)local_358 + 9) = 's';
  *(char *)((long)local_358 + 10) = 't';
  *(char *)((long)local_358 + 0xb) = ' ';
  *(char *)((long)local_358 + 0xc) = 'b';
  *(char *)((long)local_358 + 0xd) = 'e';
  *(char *)((long)local_358 + 0xe) = ' ';
  *(char *)((long)local_358 + 0xf) = 'a';
  local_350 = (__hashtable_alloc *)local_1b0._0_8_;
  local_358->_M_local_buf[local_1b0._0_8_] = '\0';
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_2f8,(key_type *)local_268);
  p_Var1 = &local_2f8._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar10._M_node != p_Var1) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)(cVar10._M_node + 2),_S_in);
    std::istream::_M_extract<unsigned_long>((ulong *)local_1b0);
    bVar3 = abStack_190[*(long *)(local_1b0._0_8_ + -0x18)];
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
    if ((bVar3 & 5) != 0) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(0x28);
      p_Var2 = local_350;
      local_1b0._0_8_ = local_1b0 + 0x10;
      local_1a0._M_allocated_capacity._0_4_ = local_348._M_allocated_capacity._0_4_;
      local_1a0._M_allocated_capacity._4_4_ = local_348._M_allocated_capacity._4_4_;
      if (local_358 == &local_348) {
        local_1a0._M_local_buf[8] = (char)local_348._8_4_;
        local_1a0._9_2_ = (undefined2)((uint)local_348._8_4_ >> 8);
        local_1a0._M_local_buf[0xb] = (char)((uint)local_348._8_4_ >> 0x18);
        local_1a0._12_4_ = local_348._12_4_;
        local_358 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._0_8_;
      }
      local_350 = (__hashtable_alloc *)0x0;
      local_348._M_allocated_capacity = local_348._M_allocated_capacity & 0xffffffffffffff00;
      *puVar11 = &PTR__ConfigurationException_001b4178;
      puVar11[1] = puVar11 + 3;
      if (local_358 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_) {
        *(undefined4 *)(puVar11 + 3) = local_1a0._M_allocated_capacity._0_4_;
        *(undefined4 *)((long)puVar11 + 0x1c) = local_1a0._M_allocated_capacity._4_4_;
        *(uint *)(puVar11 + 4) =
             CONCAT13(local_1a0._M_local_buf[0xb],
                      CONCAT21(local_1a0._9_2_,local_1a0._M_local_buf[8]));
        *(undefined4 *)((long)puVar11 + 0x24) = local_1a0._12_4_;
      }
      else {
        puVar11[1] = local_358;
        puVar11[3] = CONCAT44(local_1a0._M_allocated_capacity._4_4_,
                              local_1a0._M_allocated_capacity._0_4_);
      }
      puVar11[2] = p_Var2;
      local_1b0._8_8_ = 0;
      local_1a0._M_allocated_capacity._0_4_ = local_1a0._M_allocated_capacity._0_4_ & 0xffffff00;
      local_358 = &local_348;
      __cxa_throw(puVar11,&ConfigurationException::typeinfo,
                  ConfigurationException::~ConfigurationException);
    }
    (__return_storage_ptr__->testParams).seed = (uint64_t)local_1f0._M_dataplus._M_p;
  }
  if (local_358 != &local_348) {
    operator_delete(local_358);
  }
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_);
  }
  p_Var2 = (__hashtable_alloc *)(local_1b0 + 0x10);
  local_1a0._M_allocated_capacity._0_4_ = 0x5f78616d;
  local_1a0._M_allocated_capacity._4_4_ = 0x63637573;
  local_1a0._M_local_buf[8] = 'e';
  local_1a0._9_2_ = 0x7373;
  local_1b0._8_8_ = 0xb;
  local_1a0._M_local_buf[0xb] = '\0';
  local_210._M_dataplus._M_p = (pointer)0x32;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1b0._0_8_ = p_Var2;
  local_1f0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1f0,(ulong)&local_210);
  local_1f0.field_2._M_allocated_capacity = (size_type)local_210._M_dataplus._M_p;
  builtin_strncpy(local_1f0._M_dataplus._M_p,"\'max_success\' must be a valid non-negative integer",
                  0x32);
  local_1f0._M_string_length = (size_type)local_210._M_dataplus._M_p;
  local_1f0._M_dataplus._M_p[(long)local_210._M_dataplus._M_p] = '\0';
  (anonymous_namespace)::loadParam<int,bool(int)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2f8,(string *)local_1b0,&(__return_storage_ptr__->testParams).maxSuccess,
             &local_1f0,(_func_bool_int *)in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((__hashtable_alloc *)local_1b0._0_8_ != p_Var2) {
    operator_delete((void *)local_1b0._0_8_);
  }
  local_1a0._M_allocated_capacity._0_4_ = 0x5f78616d;
  local_1a0._M_allocated_capacity._4_4_ = 0x657a6973;
  local_1b0._8_8_ = 8;
  local_1a0._M_local_buf[8] = '\0';
  local_288._M_dataplus._M_p = (pointer)0x2f;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_1b0._0_8_ = p_Var2;
  local_210._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_210,(ulong)&local_288);
  local_210.field_2._M_allocated_capacity = (size_type)local_288._M_dataplus._M_p;
  builtin_strncpy(local_210._M_dataplus._M_p,"\'max_size\' must be a valid non-negative integer",
                  0x2f);
  local_210._M_string_length = (size_type)local_288._M_dataplus._M_p;
  local_210._M_dataplus._M_p[(long)local_288._M_dataplus._M_p] = '\0';
  (anonymous_namespace)::loadParam<int,bool(int)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2f8,(string *)local_1b0,&(__return_storage_ptr__->testParams).maxSize,
             &local_210,(_func_bool_int *)in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((__hashtable_alloc *)local_1b0._0_8_ != p_Var2) {
    operator_delete((void *)local_1b0._0_8_);
  }
  local_288._M_dataplus._M_p = (pointer)0x11;
  local_1b0._0_8_ = p_Var2;
  local_1b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_288);
  local_1a0._M_allocated_capacity._0_4_ = SUB84(local_288._M_dataplus._M_p,0);
  local_1a0._M_allocated_capacity._4_4_ = (undefined4)((ulong)local_288._M_dataplus._M_p >> 0x20);
  *(undefined8 *)local_1b0._0_8_ = 0x637369645f78616d;
  *(undefined8 *)(local_1b0._0_8_ + 8) = 0x697461725f647261;
  *(__hashtable_alloc *)(local_1b0._0_8_ + 0x10) = (__hashtable_alloc)0x6f;
  local_1b0._8_8_ = local_288._M_dataplus._M_p;
  *(__hashtable_alloc *)(local_1b0._0_8_ + (long)local_288._M_dataplus._M_p) =
       (__hashtable_alloc)0x0;
  local_230._M_dataplus._M_p = (pointer)0x38;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_288,(ulong)&local_230);
  local_288.field_2._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
  builtin_strncpy(local_288._M_dataplus._M_p,
                  "\'max_discard_ratio\' must be a valid non-negative integer",0x38);
  local_288._M_string_length = (size_type)local_230._M_dataplus._M_p;
  local_288._M_dataplus._M_p[(long)local_230._M_dataplus._M_p] = '\0';
  (anonymous_namespace)::loadParam<int,bool(int)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2f8,(string *)local_1b0,&(__return_storage_ptr__->testParams).maxDiscardRatio
             ,&local_288,(_func_bool_int *)in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((__hashtable_alloc *)local_1b0._0_8_ != p_Var2) {
    operator_delete((void *)local_1b0._0_8_);
  }
  local_1a0._M_allocated_capacity._0_4_ = 0x68736f6e;
  local_1a0._M_allocated_capacity._4_4_ = 0x6b6e6972;
  local_1b0._8_8_ = 8;
  local_1a0._M_local_buf[8] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)0x24;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_1b0._0_8_ = p_Var2;
  local_230._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)&local_2a8);
  local_230.field_2._M_allocated_capacity = (size_type)local_2a8._M_dataplus._M_p;
  builtin_strncpy(local_230._M_dataplus._M_p,"\'noshrink\' must be either \'1\' or \'0\'",0x24);
  local_230._M_string_length = (size_type)local_2a8._M_dataplus._M_p;
  local_230._M_dataplus._M_p[(long)local_2a8._M_dataplus._M_p] = '\0';
  (anonymous_namespace)::loadParam<bool,bool(bool_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2f8,(string *)local_1b0,
             &(__return_storage_ptr__->testParams).disableShrinking,&local_230,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((__hashtable_alloc *)local_1b0._0_8_ != p_Var2) {
    operator_delete((void *)local_1b0._0_8_);
  }
  local_2a8._M_dataplus._M_p = (pointer)0x10;
  local_1b0._0_8_ = p_Var2;
  local_1b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_2a8);
  local_1a0._M_allocated_capacity._0_4_ = SUB84(local_2a8._M_dataplus._M_p,0);
  local_1a0._M_allocated_capacity._4_4_ = (undefined4)((ulong)local_2a8._M_dataplus._M_p >> 0x20);
  *(undefined8 *)local_1b0._0_8_ = 0x5f65736f62726576;
  *(undefined8 *)(local_1b0._0_8_ + 8) = 0x73736572676f7270;
  local_1b0._8_8_ = local_2a8._M_dataplus._M_p;
  *(__hashtable_alloc *)(local_1b0._0_8_ + (long)local_2a8._M_dataplus._M_p) =
       (__hashtable_alloc)0x0;
  local_2c8._M_dataplus._M_p = (pointer)0x2c;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2a8,(ulong)&local_2c8);
  local_2a8.field_2._M_allocated_capacity = (size_type)local_2c8._M_dataplus._M_p;
  builtin_strncpy(local_2a8._M_dataplus._M_p,"\'verbose_progress\' must be either \'1\' or \'0\'",
                  0x2c);
  local_2a8._M_string_length = (size_type)local_2c8._M_dataplus._M_p;
  local_2a8._M_dataplus._M_p[(long)local_2c8._M_dataplus._M_p] = '\0';
  (anonymous_namespace)::loadParam<bool,bool(bool_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2f8,(string *)local_1b0,&__return_storage_ptr__->verboseProgress,&local_2a8,
             in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((__hashtable_alloc *)local_1b0._0_8_ != p_Var2) {
    operator_delete((void *)local_1b0._0_8_);
  }
  local_2c8._M_dataplus._M_p = (pointer)0x11;
  local_1b0._0_8_ = p_Var2;
  local_1b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_2c8);
  local_1a0._M_allocated_capacity._0_4_ = SUB84(local_2c8._M_dataplus._M_p,0);
  local_1a0._M_allocated_capacity._4_4_ = (undefined4)((ulong)local_2c8._M_dataplus._M_p >> 0x20);
  *(undefined8 *)local_1b0._0_8_ = 0x5f65736f62726576;
  *(undefined8 *)(local_1b0._0_8_ + 8) = 0x6e696b6e69726873;
  *(__hashtable_alloc *)(local_1b0._0_8_ + 0x10) = (__hashtable_alloc)0x67;
  local_1b0._8_8_ = local_2c8._M_dataplus._M_p;
  *(__hashtable_alloc *)(local_1b0._0_8_ + (long)local_2c8._M_dataplus._M_p) =
       (__hashtable_alloc)0x0;
  local_1d0._M_dataplus._M_p = (pointer)0x2d;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2c8,(ulong)&local_1d0);
  local_2c8.field_2._M_allocated_capacity = (size_type)local_1d0._M_dataplus._M_p;
  builtin_strncpy(local_2c8._M_dataplus._M_p,"\'verbose_shrinking\' must be either \'1\' or \'0\'",
                  0x2d);
  local_2c8._M_string_length = (size_type)local_1d0._M_dataplus._M_p;
  local_2c8._M_dataplus._M_p[(long)local_1d0._M_dataplus._M_p] = '\0';
  (anonymous_namespace)::loadParam<bool,bool(bool_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2f8,(string *)local_1b0,&__return_storage_ptr__->verboseShrinking,&local_2c8,
             in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if ((__hashtable_alloc *)local_1b0._0_8_ != p_Var2) {
    operator_delete((void *)local_1b0._0_8_);
  }
  local_1d0.field_2._M_allocated_capacity = 0x6375646f72706572;
  local_1d0.field_2._8_2_ = 0x65;
  local_1d0._M_string_length = 9;
  local_1b0._0_8_ = (__hashtable_alloc *)0x25;
  local_338 = local_328;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_338 = (__hashtable_alloc **)
              std::__cxx11::string::_M_create((ulong *)&local_338,(ulong)local_1b0);
  local_328[0] = (__hashtable_alloc *)local_1b0._0_8_;
  local_338[2] = (__hashtable_alloc *)0x692073616820676e;
  local_338[3] = (__hashtable_alloc *)0x662064696c61766e;
  *local_338 = (__hashtable_alloc *)0x75646f7270657227;
  local_338[1] = (__hashtable_alloc *)0x6972747320276563;
  builtin_strncpy((char *)((long)local_338 + 0x1d),"d format",8);
  local_330 = (__hashtable_alloc *)local_1b0._0_8_;
  *(__hashtable_alloc *)((long)local_338 + local_1b0._0_8_) = (__hashtable_alloc)0x0;
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_2f8,&local_1d0);
  if ((_Rb_tree_header *)cVar10._M_node != p_Var1) {
    local_268._0_8_ = &p_Stack_238;
    local_268._8_8_ = 1;
    local_268._16_8_ = 0;
    local_268._24_8_ = 0;
    local_248 = 1.0;
    local_240 = 0;
    p_Stack_238 = (__node_base_ptr)0x0;
    stringToReproduceMap
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
                *)local_1b0,(string *)(cVar10._M_node + 2));
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_268,local_1b0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_1b0);
    if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)local_268 != &this->_M_h) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,rc::detail::Reproduce>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,rc::detail::Reproduce>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,rc::detail::Reproduce>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this,(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_268);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_268);
  }
  if (local_338 != local_328) {
    operator_delete(local_338);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2f8);
  return __return_storage_ptr__;
}

Assistant:

Configuration configFromString(const std::string &str,
                               const Configuration &defaults) {
  try {
    return configFromMap(parseMap(str), defaults);
  } catch (const ParseException &e) {
    throw ConfigurationException(
        std::string("Failed to parse configuration string -- ") + e.what());
  }
}